

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threaded_resampler.h
# Opt level: O0

void __thiscall crnlib::threaded_resampler::params::clear(params *this)

{
  params *this_local;
  
  utils::zero_object<crnlib::threaded_resampler::params>(this);
  this->m_boundary_op = BOUNDARY_CLAMP;
  this->m_sample_low = 0.0;
  this->m_sample_high = 255.0;
  this->m_Pfilter_name = "lanczos4";
  this->m_filter_x_scale = 1.0;
  this->m_filter_y_scale = 1.0;
  return;
}

Assistant:

void clear()
            {
                utils::zero_object(*this);

                m_boundary_op = Resampler::BOUNDARY_CLAMP;
                m_sample_low = 0.0f;
                m_sample_high = 255.0f;
                m_Pfilter_name = CRNLIB_RESAMPLER_DEFAULT_FILTER;
                m_filter_x_scale = 1.0f;
                m_filter_y_scale = 1.0f;
            }